

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_sah_builder.h
# Opt level: O3

size_t __thiscall
bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL>::fallback_split
          (BinnedSahBuilder<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_8UL> *this,size_t axis,
          size_t begin,size_t end)

{
  pointer puVar1;
  ulong uVar2;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_binned_sah_builder_h:124:13)>
  __comp;
  size_t local_38;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_binned_sah_builder_h:124:13)>
  local_30;
  
  local_30._M_comp.axis = &local_38;
  puVar1 = (this->prim_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = begin + 1 + end >> 1;
  __comp._M_comp.axis = &local_38;
  __comp._M_comp.this = this;
  local_38 = axis;
  local_30._M_comp.this = this;
  std::
  __heap_select<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,8ul>::fallback_split(unsigned_long,unsigned_long,unsigned_long)::_lambda(unsigned_long,unsigned_long)_1_>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(puVar1 + begin),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(puVar1 + uVar2),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(puVar1 + end),__comp);
  std::
  __sort_heap<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<bvh::v2::BinnedSahBuilder<bvh::v2::Node<float,3ul,32ul,4ul>,8ul>::fallback_split(unsigned_long,unsigned_long,unsigned_long)::_lambda(unsigned_long,unsigned_long)_1_>>
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(puVar1 + begin),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(puVar1 + uVar2),&local_30);
  return uVar2;
}

Assistant:

size_t fallback_split(size_t axis, size_t begin, size_t end) {
        size_t mid = (begin + end + 1) / 2;
        std::partial_sort(
            prim_ids_.begin() + begin,
            prim_ids_.begin() + mid,
            prim_ids_.begin() + end,
            [&] (size_t i, size_t j) { return centers_[i][axis] < centers_[j][axis]; });
        return mid;
    }